

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbistbl.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::RBBISymbolTable::parseReference
          (UnicodeString *__return_storage_ptr__,RBBISymbolTable *this,UnicodeString *text,
          ParsePosition *pos,int32_t limit)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  UBool UVar4;
  uint uVar5;
  long lVar6;
  char16_t *pcVar7;
  ulong uVar8;
  ulong uVar9;
  uint c;
  
  uVar2 = pos->index;
  uVar8 = (ulong)(int)uVar2;
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003be258;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  if (limit < (int)uVar2) {
    limit = uVar2;
  }
  lVar6 = 0;
  uVar9 = uVar8;
  do {
    if ((long)limit - uVar8 == lVar6) {
      uVar9 = (ulong)(uint)limit;
      goto LAB_002a18ba;
    }
    sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      uVar5 = (text->fUnion).fFields.fLength;
    }
    else {
      uVar5 = (int)sVar1 >> 5;
    }
    iVar3 = (int)lVar6;
    c = 0xffff;
    if (uVar2 + iVar3 < uVar5) {
      pcVar7 = (char16_t *)((long)&text->fUnion + 2);
      if (((int)sVar1 & 2U) == 0) {
        pcVar7 = (text->fUnion).fFields.fArray;
      }
      c = (uint)(ushort)pcVar7[uVar8 + lVar6];
    }
    if (lVar6 == 0) {
      UVar4 = u_isIDStart_63(c);
      if (UVar4 == '\0') {
        uVar9 = uVar9 & 0xffffffff;
        goto LAB_002a18ba;
      }
    }
    UVar4 = u_isIDPart_63(c);
    uVar9 = uVar9 + 1;
    lVar6 = lVar6 + 1;
  } while (UVar4 != '\0');
  uVar9 = (ulong)(iVar3 + uVar2);
LAB_002a18ba:
  if ((uint)uVar9 != uVar2) {
    pos->index = (uint)uVar9;
    (*(text->super_Replaceable).super_UObject._vptr_UObject[3])
              (text,uVar8,uVar9,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString   RBBISymbolTable::parseReference(const UnicodeString& text,
                                                ParsePosition& pos, int32_t limit) const
{
    int32_t start = pos.getIndex();
    int32_t i = start;
    UnicodeString result;
    while (i < limit) {
        UChar c = text.charAt(i);
        if ((i==start && !u_isIDStart(c)) || !u_isIDPart(c)) {
            break;
        }
        ++i;
    }
    if (i == start) { // No valid name chars
        return result; // Indicate failure with empty string
    }
    pos.setIndex(i);
    text.extractBetween(start, i, result);
    return result;
}